

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O0

int checkForCompletion(CURLM *curl,int *success)

{
  int *piVar1;
  int local_2c;
  int result;
  CURLMsg *message;
  int *piStack_18;
  int numMessages;
  int *success_local;
  CURLM *curl_local;
  
  local_2c = 0;
  *success = 0;
  piStack_18 = success;
  success_local = (int *)curl;
  while (piVar1 = (int *)curl_multi_info_read(success_local,(long)&message + 4),
        piVar1 != (int *)0x0) {
    if (*piVar1 == 1) {
      if (piVar1[4] == 0) {
        *piStack_18 = 1;
      }
      else {
        *piStack_18 = 0;
      }
    }
    else {
      curl_mfprintf(_stderr,"Got an unexpected message from curl: %i\n",*piVar1);
      *piStack_18 = 0;
    }
    local_2c = 1;
  }
  return local_2c;
}

Assistant:

static int checkForCompletion(CURLM* curl, int* success)
{
  int numMessages;
  CURLMsg* message;
  int result = 0;
  *success = 0;
  while((message = curl_multi_info_read(curl, &numMessages)) != NULL) {
    if(message->msg == CURLMSG_DONE) {
      result = 1;
      if(message->data.result == CURLE_OK)
        *success = 1;
      else
        *success = 0;
    }
    else {
      fprintf(stderr, "Got an unexpected message from curl: %i\n",
              (int)message->msg);
      result = 1;
      *success = 0;
    }
  }
  return result;
}